

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O0

void mpp_writer_put_bits(MppWriteCtx *ctx,RK_S32 val,RK_S32 len)

{
  uint uVar1;
  RK_U32 RVar2;
  byte bVar3;
  MPP_RET MVar4;
  RK_U32 local_34;
  RK_U32 local_30;
  RK_S32 byteCnt;
  RK_S32 zeroBytes;
  RK_U32 byte_buffer;
  RK_U8 *stream;
  RK_S32 bits;
  RK_S32 len_local;
  RK_S32 val_local;
  MppWriteCtx *ctx_local;
  
  _zeroBytes = ctx->stream;
  uVar1 = ctx->byte_buffer;
  if (val != 0) {
    if ((1 << ((byte)len & 0x1f) <= val) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"val < (1 << len)",
                   "mpp_writer_put_bits",0x77), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((0x18 < len) &&
       (_mpp_log_l(2,(char *)0x0,"Assertion %s failed at %s:%d\n",(char *)0x0,"len < 25",
                   "mpp_writer_put_bits",0x78), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
  }
  stream._4_4_ = len + ctx->buffered_bits;
  byteCnt = uVar1 | val << (0x20U - (char)stream._4_4_ & 0x1f);
  while( true ) {
    if ((int)stream._4_4_ < 8) {
      ctx->buffered_bits = stream._4_4_ & 0xff;
      ctx->byte_buffer = byteCnt;
      return;
    }
    local_30 = ctx->zero_bytes;
    RVar2 = ctx->byte_cnt;
    MVar4 = mpp_writer_status(ctx);
    if (MVar4 != MPP_OK) break;
    bVar3 = (byte)((uint)byteCnt >> 0x18);
    *_zeroBytes = bVar3;
    local_34 = RVar2 + 1;
    if ((local_30 == 2) && (*_zeroBytes < 4)) {
      *_zeroBytes = 3;
      _zeroBytes[1] = bVar3;
      local_34 = RVar2 + 2;
      local_30 = 0;
      ctx->emul_cnt = ctx->emul_cnt + 1;
      _zeroBytes = _zeroBytes + 1;
    }
    if (*_zeroBytes == 0) {
      local_30 = local_30 + 1;
    }
    else {
      local_30 = 0;
    }
    stream._4_4_ = stream._4_4_ - 8;
    byteCnt = byteCnt << 8;
    _zeroBytes = _zeroBytes + 1;
    ctx->zero_bytes = local_30;
    ctx->byte_cnt = local_34;
    ctx->stream = _zeroBytes;
  }
  return;
}

Assistant:

void mpp_writer_put_bits(MppWriteCtx * ctx, RK_S32 val, RK_S32 len)
{
    RK_S32 bits;
    RK_U8 *stream = ctx->stream;
    RK_U32 byte_buffer = ctx->byte_buffer;

    if (val) {
        mpp_assert(val < (1 << len));
        mpp_assert(len < 25);
    }
    bits = len + ctx->buffered_bits;

    byte_buffer = byte_buffer | ((RK_U32) val << (32 - bits));

    while (bits > 7) {
        RK_S32 zeroBytes = ctx->zero_bytes;
        RK_S32 byteCnt = ctx->byte_cnt;

        if (mpp_writer_status(ctx))
            return;

        *stream = (RK_U8) (byte_buffer >> 24);

        byteCnt++;
        if ((zeroBytes == 2) && (*stream < 4)) {
            *stream++ = 3;
            *stream = (RK_U8) (byte_buffer >> 24);
            byteCnt++;
            zeroBytes = 0;
            ctx->emul_cnt++;
        }

        if (*stream == 0)
            zeroBytes++;
        else
            zeroBytes = 0;

        bits -= 8;
        byte_buffer <<= 8;
        stream++;
        ctx->zero_bytes = zeroBytes;
        ctx->byte_cnt = byteCnt;
        ctx->stream = stream;
    }

    ctx->buffered_bits = (RK_U8) bits;
    ctx->byte_buffer = byte_buffer;
}